

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

int anon_unknown.dwarf_51020e::cmFileDownloadProgressCallback
              (void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  bool bVar1;
  string status;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  bVar1 = cURLProgressHelper::UpdatePercentage
                    ((cURLProgressHelper *)clientp,dlnow,dltotal,&local_28);
  if (bVar1) {
    cmMakefile::DisplayStatus
              (*(cmMakefile **)(*(long *)((long)clientp + 8) + 8),local_28._M_dataplus._M_p,-1.0);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

static int
  cmFileDownloadProgressCallback(void *clientp,
                                 double dltotal, double dlnow,
                                 double ultotal, double ulnow)
    {
    cURLProgressHelper *helper =
      reinterpret_cast<cURLProgressHelper *>(clientp);

    static_cast<void>(ultotal);
    static_cast<void>(ulnow);

    std::string status;
    if (helper->UpdatePercentage(dlnow, dltotal, status))
      {
      cmFileCommand *fc = helper->GetFileCommand();
      cmMakefile *mf = fc->GetMakefile();
      mf->DisplayStatus(status.c_str(), -1);
      }

    return 0;
    }